

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void compact_alphabet(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint *puVar1;
  uchar *v;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  pointer puVar3;
  uint *puVar4;
  uchar uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> elems;
  allocator_type local_21;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  _Var2 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,
             (ulong)(*_Var2._M_current + 1),&local_21);
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    local_20._M_impl.super__Vector_impl_data._M_start[*puVar4] = '\x01';
  }
  uVar5 = '\0';
  for (puVar3 = local_20._M_impl.super__Vector_impl_data._M_start;
      puVar3 != local_20._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    if (*puVar3 != '\0') {
      *puVar3 = uVar5;
      uVar5 = uVar5 + '\x01';
    }
  }
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar4 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    *puVar4 = (uint)local_20._M_impl.super__Vector_impl_data._M_start[*puVar4];
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return;
}

Assistant:

void compact_alphabet(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<uint8_t> elems(max_elem + 1);
    for (const auto& v : vec)
        elems[v] = 1;
    uint32_t cur = 0;
    for (auto& v : elems) {
        if (v != 0) {
            v = cur;
            cur++;
        }
    }
    for (auto& x : vec)
        x = elems[x];
}